

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

wchar_t * fmt::v8::detail::
          parse_align<wchar_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<wchar_t>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v8::detail::specs_handler<wchar_t>_> *handler)

{
  wchar_t wVar1;
  align_t align;
  type tVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  bool bVar5;
  basic_string_view<wchar_t> fill;
  
  if (begin == end) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x8e2,"");
  }
  pwVar3 = begin + 1;
  pwVar4 = begin;
  if (pwVar3 < end) {
    pwVar4 = pwVar3;
  }
  do {
    wVar1 = *pwVar4;
    if (wVar1 == L'^') {
      align = center;
LAB_001a920a:
      if ((long)pwVar4 - (long)begin != 0) {
        if (*begin == L'{') {
          fmt::v8::detail::throw_format_error("invalid fill character \'{\'");
        }
        tVar2 = to_unsigned<long>((long)pwVar4 - (long)begin >> 2);
        fill.size_ = tVar2;
        fill.data_ = begin;
        specs_setter<wchar_t>::on_fill((specs_setter<wchar_t> *)handler,fill);
        pwVar3 = pwVar4 + 1;
      }
      specs_checker<fmt::v8::detail::specs_handler<wchar_t>_>::on_align(handler,align);
      return pwVar3;
    }
    if (wVar1 == L'>') {
      align = right;
      goto LAB_001a920a;
    }
    if (wVar1 == L'<') {
      align = left;
      goto LAB_001a920a;
    }
    bVar5 = pwVar4 == begin;
    pwVar4 = begin;
    if (bVar5) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR auto parse_align(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = begin + code_point_length(begin);
  if (p >= end) p = begin;
  for (;;) {
    switch (to_ascii(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
    case '^':
      align = align::center;
      break;
    default:
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}